

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O2

void select_transform(JXFORM_CODE transform)

{
  char *pcVar1;
  FILE *pFVar2;
  
  if (transformoption.transform == JXFORM_NONE || transformoption.transform == transform) {
    transformoption.transform = transform;
    return;
  }
  pcVar1 = "%s: can only do one image transformation at a time\n";
  pFVar2 = _stderr;
  fprintf(_stderr,"%s: can only do one image transformation at a time\n",progname);
  usage();
  if (*(int *)(*(long *)pFVar2 + 0x7c) != 0) {
    return;
  }
  *(code **)pcVar1 = progress_monitor;
  pcVar1[0x20] = '\0';
  pcVar1[0x21] = '\0';
  pcVar1[0x22] = '\0';
  pcVar1[0x23] = '\0';
  pcVar1[0x24] = '\0';
  pcVar1[0x25] = '\0';
  pcVar1[0x26] = '\0';
  pcVar1[0x27] = '\0';
  pcVar1[0x28] = '\0';
  pcVar1[0x29] = '\0';
  pcVar1[0x2a] = '\0';
  pcVar1[0x2b] = '\0';
  pcVar1[0x2c] = '\0';
  pcVar1[0x2d] = '\0';
  pcVar1[0x2e] = '\0';
  pcVar1[0x2f] = '\0';
  pcVar1[0x30] = -1;
  pcVar1[0x31] = -1;
  pcVar1[0x32] = -1;
  pcVar1[0x33] = -1;
  pFVar2->_IO_read_end = pcVar1;
  return;
}

Assistant:

LOCAL(void)
select_transform(JXFORM_CODE transform)
/* Silly little routine to detect multiple transform options,
 * which we can't handle.
 */
{
#if TRANSFORMS_SUPPORTED
  if (transformoption.transform == JXFORM_NONE ||
      transformoption.transform == transform) {
    transformoption.transform = transform;
  } else {
    fprintf(stderr, "%s: can only do one image transformation at a time\n",
            progname);
    usage();
  }
#else
  fprintf(stderr, "%s: sorry, image transformation was not compiled\n",
          progname);
  exit(EXIT_FAILURE);
#endif
}